

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

void Fra_SmlSavePattern(Fra_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  void *pvVar2;
  uint uVar3;
  
  uVar3 = 0;
  memset(p->pPatWords,0,(long)p->nPatWords << 2);
  while( true ) {
    p_00 = p->pManFraig->vCis;
    if (p_00->nSize <= (int)uVar3) {
      if (p->vCex != (Vec_Int_t *)0x0) {
        p->vCex->nSize = 0;
        for (uVar3 = 0; (int)uVar3 < p->pManAig->nObjs[2] - p->pManAig->nRegs; uVar3 = uVar3 + 1) {
          Vec_IntPush(p->vCex,(uint)((p->pPatWords[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0));
        }
        iVar1 = p->pManFraig->nObjs[2];
        for (uVar3 = iVar1 - p->pManFraig->nRegs; (int)uVar3 < iVar1; uVar3 = uVar3 + 1) {
          Vec_IntPush(p->vCex,(uint)((p->pPatWords[(int)uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0));
          iVar1 = p->pManFraig->nObjs[2];
        }
      }
      return;
    }
    pvVar2 = Vec_PtrEntry(p_00,uVar3);
    iVar1 = *(int *)(*(long *)(*(long *)((long)pvVar2 + 0x28) + 0x98) +
                    (long)*(int *)((long)pvVar2 + 0x24) * 4);
    if (((long)iVar1 < 0) || (p->pSat->size <= iVar1)) break;
    if (p->pSat->model[iVar1] == 1) {
      p->pPatWords[uVar3 >> 5] = p->pPatWords[uVar3 >> 5] | 1 << ((byte)uVar3 & 0x1f);
    }
    uVar3 = uVar3 + 1;
  }
  __assert_fail("v >= 0 && v < s->size",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                ,0xd0,"int sat_solver_var_value(sat_solver *, int)");
}

Assistant:

void Fra_SmlSavePattern( Fra_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Aig_ManForEachCi( p->pManFraig, pObj, i )
//        if ( p->pSat->model.ptr[Fra_ObjSatNum(pObj)] == l_True )
        if ( sat_solver_var_value(p->pSat, Fra_ObjSatNum(pObj)) )
            Abc_InfoSetBit( p->pPatWords, i );

    if ( p->vCex )
    {
        Vec_IntClear( p->vCex );
        for ( i = 0; i < Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig); i++ )
            Vec_IntPush( p->vCex, Abc_InfoHasBit( p->pPatWords, i ) );
        for ( i = Aig_ManCiNum(p->pManFraig) - Aig_ManRegNum(p->pManFraig); i < Aig_ManCiNum(p->pManFraig); i++ )
            Vec_IntPush( p->vCex, Abc_InfoHasBit( p->pPatWords, i ) );
    }

/*
    printf( "Pattern: " );
    Aig_ManForEachCi( p->pManFraig, pObj, i )
        printf( "%d", Abc_InfoHasBit( p->pPatWords, i ) );
    printf( "\n" );
*/
}